

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# static_error.h
# Opt level: O2

ostream * jsonnet::internal::operator<<(ostream *o,StaticError *err)

{
  string local_30;
  
  StaticError::toString_abi_cxx11_(&local_30,err);
  std::operator<<(o,(string *)&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return o;
}

Assistant:

static inline std::ostream &operator<<(std::ostream &o, const StaticError &err)
{
    o << err.toString();
    return o;
}